

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qringbuffer.cpp
# Opt level: O0

qint64 __thiscall QRingBuffer::peek(QRingBuffer *this,char *data,qint64 maxLength,qint64 pos)

{
  size_t __n;
  bool bVar1;
  QRingChunk *this_00;
  qsizetype qVar2;
  size_t *psVar3;
  char *pcVar4;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_FS_OFFSET;
  qint64 blockLength;
  QRingChunk *chunk;
  QList<QRingChunk> *__range1;
  qint64 readSoFar;
  const_iterator __end1;
  const_iterator __begin1;
  QRingChunk *in_stack_ffffffffffffff80;
  long local_58;
  long local_50;
  long local_30;
  long local_28;
  QRingChunk *local_20;
  const_iterator local_18;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = 0;
  local_10.i = (QRingChunk *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QRingChunk>::begin(in_stack_ffffffffffffff80);
  local_18.i = (QRingChunk *)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = QList<QRingChunk>::end(in_stack_ffffffffffffff80);
  local_50 = in_RCX;
  while( true ) {
    local_20 = local_18.i;
    bVar1 = QList<QRingChunk>::const_iterator::operator!=(&local_10,local_18);
    if ((!bVar1) ||
       (this_00 = QList<QRingChunk>::const_iterator::operator*(&local_10), local_58 == in_RDX))
    break;
    qVar2 = QRingChunk::size(this_00);
    if (local_50 < qVar2) {
      local_28 = qVar2 - local_50;
      local_30 = in_RDX - local_58;
      psVar3 = (size_t *)qMin<long_long>(&local_28,&local_30);
      __n = *psVar3;
      pcVar4 = QRingChunk::data(in_stack_ffffffffffffff80);
      memcpy((void *)(in_RSI + local_58),pcVar4 + local_50,__n);
      local_58 = __n + local_58;
      local_50 = 0;
    }
    else {
      local_50 = local_50 - qVar2;
    }
    QList<QRingChunk>::const_iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_58;
}

Assistant:

qint64 QRingBuffer::peek(char *data, qint64 maxLength, qint64 pos) const
{
    Q_ASSERT(maxLength >= 0 && pos >= 0);

    qint64 readSoFar = 0;
    for (const QRingChunk &chunk : buffers) {
        if (readSoFar == maxLength)
            break;

        qint64 blockLength = chunk.size();
        if (pos < blockLength) {
            blockLength = qMin(blockLength - pos, maxLength - readSoFar);
            memcpy(data + readSoFar, chunk.data() + pos, blockLength);
            readSoFar += blockLength;
            pos = 0;
        } else {
            pos -= blockLength;
        }
    }

    return readSoFar;
}